

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  EnumOptions *pEVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  lVar2 = (long)(this->value_).super_RepeatedPtrFieldBase.current_size_;
  do {
    lVar4 = lVar2;
    if (lVar4 < 1) goto LAB_002fdeb9;
    bVar3 = EnumValueDescriptorProto::IsInitialized
                      ((EnumValueDescriptorProto *)
                       ((this->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4 + -1]);
    lVar2 = lVar4 + -1;
  } while (bVar3);
  if (0 < lVar4) {
    return false;
  }
LAB_002fdeb9:
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    pEVar1 = this->options_;
    bVar3 = internal::ExtensionSet::IsInitialized(&pEVar1->_extensions_);
    if (!bVar3) {
      return false;
    }
    bVar3 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                      (&pEVar1->uninterpreted_option_);
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->value())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}